

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O1

vector<ComponentData,_std::allocator<ComponentData>_> *
computeComponentsAndCycles
          (vector<ComponentData,_std::allocator<ComponentData>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *stateSpace)

{
  pointer pCVar1;
  pointer pCVar2;
  iterator iVar3;
  ulong uVar4;
  pointer plVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  ulong uVar9;
  long pt;
  vector<long,_std::allocator<long>_> limitCycles;
  vector<long,_std::allocator<long>_> cycle;
  ulong local_70;
  long *local_68;
  iterator iStack_60;
  long *local_58;
  ulong local_50;
  vector<long,_std::allocator<long>_> local_48;
  
  local_68 = (long *)0xffffffffffffffff;
  std::vector<long,_std::allocator<long>_>::vector
            (&local_48,
             (long)(stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type_conflict3 *)&local_68,
             (allocator_type *)&local_70);
  local_68 = (long *)0x0;
  iStack_60._M_current = (long *)0x0;
  local_58 = (long *)0x0;
  plVar5 = (stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish != plVar5) {
    uVar9 = 0;
    lVar6 = 0;
    do {
      if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9] < 0) {
        lVar8 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9];
        local_70 = uVar9;
        if (lVar8 == -1) {
          plVar7 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar9;
          do {
            *plVar7 = lVar6;
            local_70 = plVar5[local_70];
            plVar7 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start + local_70;
            lVar8 = *plVar7;
          } while (lVar8 == -1);
        }
        uVar4 = uVar9;
        if (lVar8 == lVar6) {
          if (iStack_60._M_current == local_58) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_68,iStack_60,(long *)&local_70);
          }
          else {
            *iStack_60._M_current = local_70;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          lVar6 = lVar6 + 1;
        }
        else {
          for (; uVar4 != local_70; uVar4 = plVar5[uVar4]) {
            local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar4] = lVar8;
          }
        }
      }
      uVar9 = uVar9 + 1;
      plVar5 = (stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(stateSpace->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)plVar5 >> 3));
  }
  std::vector<ComponentData,_std::allocator<ComponentData>_>::vector
            (__return_storage_ptr__,(long)iStack_60._M_current - (long)local_68 >> 3,
             (allocator_type *)&local_70);
  if ((long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish -
      (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start != 0) {
    lVar6 = (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    pCVar2 = (__return_storage_ptr__->
             super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      pCVar1 = pCVar2 + local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8];
      pCVar1->componentSize = pCVar1->componentSize + 1;
      lVar8 = lVar8 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
  }
  if (iStack_60._M_current != local_68) {
    uVar9 = 0;
    do {
      local_70 = local_68[uVar9];
      pCVar2 = (__return_storage_ptr__->
               super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar3._M_current =
           *(pointer *)
            ((long)&pCVar2[uVar9].limitCycle.super__Vector_base<long,_std::allocator<long>_>._M_impl
            + 8);
      if (iVar3._M_current ==
          *(pointer *)
           ((long)&pCVar2[uVar9].limitCycle.super__Vector_base<long,_std::allocator<long>_>._M_impl
           + 0x10)) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&pCVar2[uVar9].limitCycle,iVar3,
                   (long *)&local_70);
      }
      else {
        *iVar3._M_current = local_70;
        *(long **)((long)&pCVar2[uVar9].limitCycle.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl + 8) = iVar3._M_current + 1;
      }
      local_50 = (stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start[local_70];
      if (local_50 != local_70) {
        do {
          pCVar2 = (__return_storage_ptr__->
                   super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3._M_current =
               *(pointer *)
                ((long)&pCVar2[uVar9].limitCycle.super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl + 8);
          if (iVar3._M_current ==
              *(pointer *)
               ((long)&pCVar2[uVar9].limitCycle.super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl + 0x10)) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&pCVar2[uVar9].limitCycle,iVar3,
                       (long *)&local_50);
          }
          else {
            *iVar3._M_current = local_50;
            *(long **)((long)&pCVar2[uVar9].limitCycle.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) =
                 iVar3._M_current + 1;
          }
          local_50 = (stateSpace->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_start[local_50];
        } while (local_50 != local_70);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)iStack_60._M_current - (long)local_68 >> 3));
  }
  if (local_68 != (long *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ComponentData> computeComponentsAndCycles(const std::vector<long>& stateSpace)
{
  // cycle[0..N-1] starts out with all -1's, and then each -1 is eventually replaced with the
  //   index of the limit cycle that state goes to (N = stateSpace.size()
  std::vector<long> cycle(stateSpace.size(), -1);

  // A growing array, the length is the number of limit cycles found so far
  std::vector<long> limitCycles; // limitCycles[i] is a state in the i-th limit cycle.

  long nextIndex = 0;
  for (long i = 0; i < stateSpace.size(); ++i)
    {
      if (cycle[i] >= 0) continue;
      long pt = i;
      while (cycle[pt] == -1)
        {
          cycle[pt] = nextIndex;
          pt = stateSpace[pt];
        }
      if (cycle[pt] == nextIndex)
        {
          limitCycles.push_back(pt);
          nextIndex++; // note nextIndex is always limitCycles.size() (as a long).
        }
      else
        {
          long thisLimtCycle = cycle[pt];
          long j = i;
          while (j != pt)
            {
              cycle[j] = thisLimtCycle;
              j = stateSpace[j];
            }
        }
    }

  // This contains the component info, and each limit cycle
  std::vector<ComponentData> result(limitCycles.size());

  // fill in the component sizes of each component
  for (long i = 0; i < cycle.size(); ++i)
    {
      result[cycle[i]].componentSize++;
    }

  for (long j = 0; j < limitCycles.size(); j++)
    {
      long pt = limitCycles[j];
      result[j].limitCycle.push_back(pt);
      long q = stateSpace[pt];
      while (q != pt)
        {
          result[j].limitCycle.push_back(q);
          q = stateSpace[q];
        }
    }
  return result;
}